

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::AndroidLogConfig::operator==(AndroidLogConfig *this,AndroidLogConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (_Var1) {
    bVar2 = ::std::operator==(&this->log_ids_,&other->log_ids_);
    if ((bVar2) && (this->min_prio_ == other->min_prio_)) {
      bVar2 = ::std::operator==(&this->filter_tags_,&other->filter_tags_);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool AndroidLogConfig::operator==(const AndroidLogConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && log_ids_ == other.log_ids_
   && min_prio_ == other.min_prio_
   && filter_tags_ == other.filter_tags_;
}